

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.h
# Opt level: O0

FieldGenerator * __thiscall
google::protobuf::compiler::cpp::FieldGeneratorTable::get
          (FieldGeneratorTable *this,FieldDescriptor *field)

{
  int v1;
  uint v2;
  Descriptor **v1_00;
  Descriptor **v2_00;
  char *pcVar1;
  LogMessage *pLVar2;
  const_reference pvVar3;
  int __c;
  int __c_00;
  LogMessage local_70;
  Voidify local_59;
  Nullable<const_char_*> local_58;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_40;
  Voidify local_29;
  Descriptor *local_28;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  FieldDescriptor *field_local;
  FieldGeneratorTable *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)field;
  field_local = (FieldDescriptor *)this;
  local_28 = FieldDescriptor::containing_type(field);
  v1_00 = absl::lts_20250127::log_internal::
          GetReferenceableValue<google::protobuf::Descriptor_const*>(&local_28);
  v2_00 = absl::lts_20250127::log_internal::
          GetReferenceableValue<google::protobuf::Descriptor_const*>(&this->descriptor_);
  local_20 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*>
                       (v1_00,v2_00,"field->containing_type() == descriptor_");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field.h"
               ,0x211,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  pcVar1 = FieldDescriptor::index
                     ((FieldDescriptor *)absl_log_internal_check_op_result,(char *)v2_00,__c);
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue((int)pcVar1);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue(0);
  pcVar1 = (char *)(ulong)v2;
  local_58 = absl::lts_20250127::log_internal::Check_GEImpl(v1,v2,"field->index() >= 0");
  if (local_58 != (Nullable<const_char_*>)0x0) {
    pcVar1 = absl::lts_20250127::implicit_cast<char_const*>(local_58);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/field.h"
               ,0x212,pcVar1);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_70);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_59,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_70);
  }
  pcVar1 = FieldDescriptor::index
                     ((FieldDescriptor *)absl_log_internal_check_op_result,pcVar1,__c_00);
  pvVar3 = std::
           vector<google::protobuf::compiler::cpp::FieldGenerator,_std::allocator<google::protobuf::compiler::cpp::FieldGenerator>_>
           ::operator[](&this->fields_,(long)(int)pcVar1);
  return pvVar3;
}

Assistant:

const FieldGenerator& get(const FieldDescriptor* field) const {
    ABSL_CHECK_EQ(field->containing_type(), descriptor_);
    ABSL_DCHECK_GE(field->index(), 0);
    return fields_[static_cast<size_t>(field->index())];
  }